

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_tls12_prf_read
          (psa_tls12_prf_key_derivation_t *tls12_prf,psa_algorithm_t alg,uint8_t *output,
          size_t output_length)

{
  uint uVar1;
  psa_status_t pVar2;
  char local_44;
  byte local_3e;
  uint8_t length;
  uint8_t offset;
  psa_status_t status;
  uint8_t hash_length;
  size_t sStack_30;
  psa_algorithm_t hash_alg;
  size_t output_length_local;
  uint8_t *output_local;
  psa_algorithm_t alg_local;
  psa_tls12_prf_key_derivation_t *tls12_prf_local;
  
  uVar1 = alg & 0xff;
  sStack_30 = output_length;
  output_length_local = (size_t)output;
  if ((uVar1 | 0x1000000) == 0x1000001) {
    local_44 = '\x10';
  }
  else if ((uVar1 | 0x1000000) == 0x1000002) {
    local_44 = '\x10';
  }
  else if ((uVar1 | 0x1000000) == 0x1000003) {
    local_44 = '\x10';
  }
  else if ((uVar1 | 0x1000000) == 0x1000004) {
    local_44 = '\x14';
  }
  else if ((uVar1 | 0x1000000) == 0x1000005) {
    local_44 = '\x14';
  }
  else if ((uVar1 | 0x1000000) == 0x1000008) {
    local_44 = '\x1c';
  }
  else if ((uVar1 | 0x1000000) == 0x1000009) {
    local_44 = ' ';
  }
  else if ((uVar1 | 0x1000000) == 0x100000a) {
    local_44 = '0';
  }
  else if ((uVar1 | 0x1000000) == 0x100000b) {
    local_44 = '@';
  }
  else if ((uVar1 | 0x1000000) == 0x100000c) {
    local_44 = '\x1c';
  }
  else if ((uVar1 | 0x1000000) == 0x100000d) {
    local_44 = ' ';
  }
  else if ((uVar1 | 0x1000000) == 0x1000010) {
    local_44 = '\x1c';
  }
  else if ((uVar1 | 0x1000000) == 0x1000011) {
    local_44 = ' ';
  }
  else if ((uVar1 | 0x1000000) == 0x1000012) {
    local_44 = '0';
  }
  else {
    local_44 = '\0';
    if ((uVar1 | 0x1000000) == 0x1000013) {
      local_44 = '@';
    }
  }
  do {
    while( true ) {
      if (sStack_30 == 0) {
        return 0;
      }
      if (tls12_prf->left_in_block == '\0') break;
      if (sStack_30 < tls12_prf->left_in_block) {
        local_3e = (byte)sStack_30;
      }
      else {
        local_3e = tls12_prf->left_in_block;
      }
      memcpy((void *)output_length_local,
             tls12_prf->output_block + (int)(uint)(byte)(local_44 - tls12_prf->left_in_block),
             (ulong)local_3e);
      output_length_local = output_length_local + (long)(int)(uint)local_3e;
      sStack_30 = sStack_30 - local_3e;
      tls12_prf->left_in_block = tls12_prf->left_in_block - local_3e;
    }
    pVar2 = psa_key_derivation_tls12_prf_generate_next_block(tls12_prf,alg);
  } while (pVar2 == 0);
  return pVar2;
}

Assistant:

static psa_status_t psa_key_derivation_tls12_prf_read(
    psa_tls12_prf_key_derivation_t *tls12_prf,
    psa_algorithm_t alg,
    uint8_t *output,
    size_t output_length )
{
    psa_algorithm_t hash_alg = PSA_ALG_TLS12_PRF_GET_HASH( alg );
    uint8_t hash_length = PSA_HASH_SIZE( hash_alg );
    psa_status_t status;
    uint8_t offset, length;

    while( output_length != 0 )
    {
        /* Check if we have fully processed the current block. */
        if( tls12_prf->left_in_block == 0 )
        {
            status = psa_key_derivation_tls12_prf_generate_next_block( tls12_prf,
                                                                       alg );
            if( status != PSA_SUCCESS )
                return( status );

            continue;
        }

        if( tls12_prf->left_in_block > output_length )
            length = (uint8_t) output_length;
        else
            length = tls12_prf->left_in_block;

        offset = hash_length - tls12_prf->left_in_block;
        memcpy( output, tls12_prf->output_block + offset, length );
        output += length;
        output_length -= length;
        tls12_prf->left_in_block -= length;
    }

    return( PSA_SUCCESS );
}